

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# easylogging++.cc
# Opt level: O0

void __thiscall
el::base::TypedConfigurations::insertFile
          (TypedConfigurations *this,Level level,string *fullFilename)

{
  bool bVar1;
  ulong uVar2;
  ostream *poVar3;
  char *pcVar4;
  ulong uVar5;
  Level in_ESI;
  anon_class_16_2_beafd95a create;
  string filePath;
  string resolvedFilename;
  Level in_stack_0000016c;
  anon_class_16_2_beafd95a *in_stack_00000170;
  string *in_stack_00000210;
  TypedConfigurations *in_stack_00000218;
  char *in_stack_ffffffffffffff90;
  string *in_stack_ffffffffffffff98;
  string local_38 [44];
  Level local_c;
  
  local_c = in_ESI;
  resolveFilename(in_stack_00000218,in_stack_00000210);
  uVar2 = std::__cxx11::string::empty();
  if ((uVar2 & 1) != 0) {
    poVar3 = std::operator<<((ostream *)&std::cerr,
                             "Could not load empty file for logging, please re-check your configurations for level ["
                            );
    pcVar4 = LevelHelper::convertToString(local_c);
    poVar3 = std::operator<<(poVar3,pcVar4);
    std::operator<<(poVar3,"]");
  }
  utils::File::extractPathFromFilename(in_stack_ffffffffffffff98,in_stack_ffffffffffffff90);
  uVar2 = std::__cxx11::string::size();
  uVar5 = std::__cxx11::string::size();
  if (uVar2 < uVar5) {
    utils::File::createPath(in_stack_ffffffffffffff98);
  }
  bVar1 = utils::std::
          unordered_map<el::Level,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<el::Level>,_std::equal_to<el::Level>,_std::allocator<std::pair<const_el::Level,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
          ::empty((unordered_map<el::Level,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<el::Level>,_std::equal_to<el::Level>,_std::allocator<std::pair<const_el::Level,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                   *)0x22e095);
  if (bVar1) {
    utils::std::
    unordered_map<el::Level,_std::shared_ptr<std::basic_fstream<char,_std::char_traits<char>_>_>,_std::hash<el::Level>,_std::equal_to<el::Level>,_std::allocator<std::pair<const_el::Level,_std::shared_ptr<std::basic_fstream<char,_std::char_traits<char>_>_>_>_>_>
    ::empty((unordered_map<el::Level,_std::shared_ptr<std::basic_fstream<char,_std::char_traits<char>_>_>,_std::hash<el::Level>,_std::equal_to<el::Level>,_std::allocator<std::pair<const_el::Level,_std::shared_ptr<std::basic_fstream<char,_std::char_traits<char>_>_>_>_>_>
             *)0x22e0ac);
  }
  insertFile::anon_class_16_2_beafd95a::operator()(in_stack_00000170,in_stack_0000016c);
  std::__cxx11::string::~string((string *)&stack0xffffffffffffff98);
  std::__cxx11::string::~string(local_38);
  return;
}

Assistant:

void TypedConfigurations::insertFile(Level level, const std::string& fullFilename) {
  std::string resolvedFilename = resolveFilename(fullFilename);
  if (resolvedFilename.empty()) {
    std::cerr << "Could not load empty file for logging, please re-check your configurations for level ["
              << LevelHelper::convertToString(level) << "]";
  }
  std::string filePath = base::utils::File::extractPathFromFilename(resolvedFilename, base::consts::kFilePathSeperator);
  if (filePath.size() < resolvedFilename.size()) {
    base::utils::File::createPath(filePath);
  }
  auto create = [&](Level level) {
    base::LogStreamsReferenceMap::iterator filestreamIter = m_logStreamsReference->find(resolvedFilename);
    base::type::fstream_t* fs = nullptr;
    if (filestreamIter == m_logStreamsReference->end()) {
      // We need a completely new stream, nothing to share with
      fs = base::utils::File::newFileStream(resolvedFilename);
      m_filenameMap.insert(std::make_pair(level, resolvedFilename));
      m_fileStreamMap.insert(std::make_pair(level, base::FileStreamPtr(fs)));
      m_logStreamsReference->insert(std::make_pair(resolvedFilename, base::FileStreamPtr(m_fileStreamMap.at(level))));
    } else {
      // Woops! we have an existing one, share it!
      m_filenameMap.insert(std::make_pair(level, filestreamIter->first));
      m_fileStreamMap.insert(std::make_pair(level, base::FileStreamPtr(filestreamIter->second)));
      fs = filestreamIter->second.get();
    }
    if (fs == nullptr) {
      // We display bad file error from newFileStream()
      ELPP_INTERNAL_ERROR("Setting [TO_FILE] of ["
                          << LevelHelper::convertToString(level) << "] to FALSE", false);
      setValue(level, false, &m_toFileMap);
    }
  };
  // If we dont have file conf for any level, create it for Level::Global first
  // otherwise create for specified level
  create(m_filenameMap.empty() && m_fileStreamMap.empty() ? Level::Global : level);
}